

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picnic_impl.c
# Opt level: O0

uint expand_challenge(uint8_t *challenge,uint num_rounds,uint8_t *collapsed)

{
  byte bVar1;
  uint num_bits;
  uint64_t uVar2;
  uint in_ESI;
  long in_RDI;
  uint remaining_bits;
  uint8_t ch;
  uint i;
  bitstream_t bs;
  uint local_34;
  bitstream_t local_30;
  uint local_14;
  long local_10;
  
  local_30.position = 0;
  local_14 = in_ESI;
  local_10 = in_RDI;
  for (local_34 = 0; local_34 < local_14; local_34 = local_34 + 1) {
    bVar1 = bitstream_get_bits_8(&local_30,2);
    if (bVar1 == 3) {
      return 0;
    }
    *(byte *)(local_10 + (ulong)local_34) = (bVar1 & 1) << 1 | (byte)((int)(uint)bVar1 >> 1);
  }
  num_bits = 8 - ((uint)local_30.position & 7);
  if ((num_bits != 0) && (uVar2 = bitstream_get_bits(&local_30,num_bits), uVar2 != 0)) {
    return 0;
  }
  return (uint)(local_30.position >> 3);
}

Assistant:

static unsigned int expand_challenge(uint8_t* challenge, unsigned int num_rounds,
                                     const uint8_t* collapsed) {
  bitstream_t bs;
  bs.buffer.r = collapsed;
  bs.position = 0;

  for (unsigned int i = 0; i < num_rounds; ++i) {
    const uint8_t ch = bitstream_get_bits_8(&bs, 2);
    if (ch == 3) {
      return 0;
    }
    // flip challenge bits according to spec
    challenge[i] = (ch & 1) << 1 | (ch >> 1);
  }

  const unsigned int remaining_bits = 8 - (bs.position % 8);
  if (remaining_bits && bitstream_get_bits(&bs, remaining_bits)) {
    return 0;
  }

  return bs.position / 8;
}